

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O3

void __thiscall Colony::move_ants(Colony *this)

{
  undefined1 (*pauVar1) [16];
  bool *pbVar2;
  int iVar3;
  Node *pNVar4;
  double dVar5;
  double dVar6;
  Node a;
  pair<int,_int> pVar7;
  int iVar8;
  pair<int,_int> pVar9;
  bool bVar10;
  long lVar11;
  Node *pNVar12;
  double **ppdVar13;
  long lVar14;
  Colony *this_00;
  Car *pCVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [8];
  double *pdVar22;
  double *pdVar23;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> feasible_edges;
  vector<double,_std::allocator<double>_> cumulative_sum;
  vector<double,_std::allocator<double>_> probs;
  vector<double,_std::allocator<double>_> ups;
  double up;
  int local_120;
  int local_11c;
  double local_118;
  undefined1 local_108 [8];
  pair<int,_int> *ppStack_100;
  Car *local_f8;
  undefined1 local_e8 [8];
  double **ppdStack_e0;
  Car *local_d8;
  undefined1 local_c8 [8];
  double **ppdStack_c0;
  Car *local_b8;
  undefined1 local_a8 [8];
  pair<int,_int> pStack_a0;
  pair<int,_int> local_98;
  double **local_88;
  pair<int,_int> *local_80;
  double **local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar8 = 0;
  do {
    bVar10 = Graph::is_all_visited(&this->super_Graph);
    pCVar15 = (this->super_Graph).cars;
    if (bVar10) goto LAB_00104f0b;
    lVar11 = (long)iVar8;
    lVar18 = lVar11 * 0x30;
    if (pCVar15[lVar11].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_start ==
        pCVar15[lVar11].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Car::add_node(pCVar15 + lVar11,(this->super_Graph).nodes,(this->super_Graph).distance_matrix);
    }
    local_108 = (undefined1  [8])0x0;
    ppStack_100 = (pair<int,_int> *)0x0;
    local_f8 = (Car *)0x0;
    this_00 = (Colony *)(this->super_Graph).cars;
    if (*(int *)((long)&this_00->super_Graph + lVar18 + 0x10) < 0x4b1) {
LAB_00104960:
      if ((this->super_Graph).num_node < 2) goto LAB_00104a89;
      lVar14 = 1;
      lVar20 = 0;
      lVar16 = 0x100000000;
      do {
        pNVar4 = (this->super_Graph).nodes;
        if ((&pNVar4[1].visited)[lVar20] == false) {
          pNVar12 = (Node *)((long)&pNVar4[1].x + lVar20);
          this_00 = (Colony *)((this->super_Graph).cars + lVar11);
          local_58._0_4_ = pNVar12->x;
          local_58._4_4_ = pNVar12->y;
          uStack_50 = *(undefined8 *)((long)&pNVar4[1].idx + lVar20);
          local_48 = *(undefined8 *)(&pNVar4[1].visited + lVar20);
          uStack_40 = *(undefined8 *)((long)&pNVar4[1].tw_close + lVar20);
          bVar10 = Car::ok_capacity((Car *)this_00,*pNVar12);
          if (bVar10) {
            this_00 = (Colony *)((this->super_Graph).cars + lVar11);
            pNVar4 = (this->super_Graph).nodes;
            pauVar1 = (undefined1 (*) [16])((long)&pNVar4[1].x + lVar20);
            local_78 = *(double ***)*pauVar1;
            uStack_70 = *(undefined8 *)(*pauVar1 + 8);
            pbVar2 = &pNVar4[1].visited + lVar20;
            local_68 = *(undefined8 *)pbVar2;
            uStack_60 = *(undefined8 *)(pbVar2 + 8);
            a.visited = (bool)(char)local_68;
            a._17_3_ = (int3)((ulong)local_68 >> 8);
            a.tw_open = (int)((ulong)local_68 >> 0x20);
            a._0_16_ = *pauVar1;
            a.tw_close = (int)uStack_60;
            a.unload_time = (int)((ulong)uStack_60 >> 0x20);
            bVar10 = Car::ok_time((Car *)this_00,a,(this->super_Graph).distance_matrix);
            if (bVar10) {
              local_a8 = (undefined1  [8])
                         ((ulong)(uint)(this->super_Graph).cars[lVar11].now_idx + lVar16);
              if ((Car *)ppStack_100 == local_f8) {
                this_00 = (Colony *)local_108;
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                           (iterator)ppStack_100,(pair<int,_int> *)local_a8);
              }
              else {
                *ppStack_100 = (pair<int,_int>)local_a8;
                ppStack_100 = ppStack_100 + 1;
              }
            }
          }
        }
        lVar14 = lVar14 + 1;
        lVar16 = lVar16 + 0x100000000;
        lVar20 = lVar20 + 0x20;
      } while (lVar14 < (this->super_Graph).num_node);
      if (local_108 == (undefined1  [8])ppStack_100) goto LAB_00104a89;
      dVar5 = get_rand(this_00);
      if (threshold <= dVar5) {
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        pStack_a0.first = 0;
        pStack_a0.second = 0;
        local_98.first = 0;
        local_98.second = 0;
        local_b8 = (Car *)0x0;
        local_c8 = (undefined1  [8])0x0;
        ppdStack_c0 = (double **)0x0;
        local_d8 = (Car *)0x0;
        local_e8 = (undefined1  [8])0x0;
        ppdStack_e0 = (double **)0x0;
        local_80 = ppStack_100;
        if (local_108 != (undefined1  [8])ppStack_100) {
          local_118 = 0.0;
          auVar21 = local_108;
          do {
            iVar19 = ((pair<int,_int> *)auVar21)->first;
            iVar3 = ((pair<int,_int> *)auVar21)->second;
            dVar5 = pow(this->etha_matrix[iVar19][iVar3],5.0);
            dVar6 = pow(this->phero_matrix[iVar19][iVar3],3.0);
            ppdVar13 = (double **)(dVar6 * dVar5);
            local_88 = ppdVar13;
            if (pStack_a0 == local_98) {
              this_00 = (Colony *)local_a8;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)this_00,(iterator)pStack_a0,
                         (double *)&local_88);
            }
            else {
              *(double ***)pStack_a0 = ppdVar13;
              pStack_a0 = (pair<int,_int>)((long)pStack_a0 + 8);
            }
            pVar9 = pStack_a0;
            local_118 = local_118 + (double)ppdVar13;
            auVar21 = (undefined1  [8])((long)auVar21 + 8);
            pVar7 = (pair<int,_int>)local_a8;
          } while (auVar21 != (undefined1  [8])local_80);
          for (; pVar7 != pVar9; pVar7 = (pair<int,_int>)((long)pVar7 + 8)) {
            local_88 = (double **)(*(double *)pVar7 / local_118);
            if ((Car *)ppdStack_c0 == local_b8) {
              this_00 = (Colony *)local_c8;
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)this_00,(iterator)ppdStack_c0,
                         (double *)&local_88);
            }
            else {
              *ppdStack_c0 = (double *)local_88;
              ppdStack_c0 = (double **)((double *)ppdStack_c0 + 1);
            }
          }
        }
        if ((Car *)ppdStack_e0 == local_d8) {
          this_00 = (Colony *)local_e8;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)this_00,(iterator)ppdStack_e0,
                     (double *)local_c8);
        }
        else {
          *ppdStack_e0 = *(double **)local_c8;
          ppdStack_e0 = ppdStack_e0 + 1;
        }
        if ((long)ppdStack_c0 - (long)local_c8 != 8) {
          lVar18 = 8;
          uVar17 = 0;
          ppdVar13 = ppdStack_c0;
          do {
            dVar5 = *(double *)((long)local_c8 + lVar18 + -8) + *(double *)((long)local_c8 + lVar18)
            ;
            *(double *)((long)local_c8 + lVar18) = dVar5;
            if ((Car *)ppdStack_e0 == local_d8) {
              this_00 = (Colony *)local_e8;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)this_00,(iterator)ppdStack_e0,
                         (double *)((long)local_c8 + lVar18));
              ppdVar13 = ppdStack_c0;
            }
            else {
              *ppdStack_e0 = (double *)dVar5;
              ppdStack_e0 = ppdStack_e0 + 1;
            }
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 + 8;
          } while (uVar17 < ((long)ppdVar13 - (long)local_c8 >> 3) - 1U);
        }
        pdVar22 = (double *)INFIN;
        dVar5 = get_rand(this_00);
        dVar6 = INFIN;
        if ((long)ppdStack_e0 - (long)local_e8 != 0) {
          lVar18 = (long)ppdStack_e0 - (long)local_e8 >> 3;
          lVar14 = 0;
          pdVar23 = pdVar22;
          do {
            pdVar22 = *(double **)((long)local_e8 + lVar14 * 8);
            iVar19 = (int)lVar14;
            if ((double)pdVar22 < dVar5 || (double)pdVar23 <= (double)pdVar22) {
              pdVar22 = pdVar23;
              iVar19 = local_120;
            }
            local_120 = iVar19;
            lVar14 = lVar14 + 1;
            pdVar23 = pdVar22;
          } while (lVar18 + (ulong)(lVar18 == 0) != lVar14);
        }
        if (((double)pdVar22 != INFIN) || (NAN((double)pdVar22) || NAN(INFIN))) {
          local_11c = ((pair<int,_int> *)((long)local_108 + (long)local_120 * 8))->second;
          iVar19 = 0;
        }
        else {
          iVar19 = 3;
        }
        if (local_e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_e8);
        }
        if (local_c8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_c8);
        }
        if ((pair<int,_int>)local_a8 != (pair<int,_int>)0x0) {
          operator_delete((void *)local_a8);
        }
        if (((double)pdVar22 != dVar6) || (NAN((double)pdVar22) || NAN(dVar6))) {
LAB_00104eca:
          iVar19 = 0;
          Car::add_node((this->super_Graph).cars + lVar11,(this->super_Graph).nodes + local_11c,
                        (this->super_Graph).distance_matrix);
        }
        bVar10 = iVar19 == 0;
        goto LAB_00104eef;
      }
      iVar19 = rand();
      local_11c = ((pair<int,_int> *)
                  ((long)local_108 +
                  ((ulong)(long)iVar19 % (ulong)((long)ppStack_100 - (long)local_108 >> 3)) * 8))->
                  second;
      goto LAB_00104eca;
    }
LAB_00104aa5:
    iVar19 = iVar8 + 1;
    if (iVar19 < (this->super_Graph).num_car) {
      bVar10 = true;
      iVar8 = iVar19;
      if (*(int *)((long)&this_00->super_Graph + lVar18 + 8) != 0) {
        Car::add_node((Car *)((long)&this_00->super_Graph + lVar18),(this->super_Graph).nodes,
                      (this->super_Graph).distance_matrix);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"cannot visit all customers this step.",0x25);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      bVar10 = false;
    }
LAB_00104eef:
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108);
    }
  } while (bVar10);
  pCVar15 = (this->super_Graph).cars;
LAB_00104f0b:
  if (pCVar15[iVar8].now_idx != 0) {
    Car::add_node(pCVar15 + iVar8,(this->super_Graph).nodes,(this->super_Graph).distance_matrix);
  }
  return;
LAB_00104a89:
  this_00 = (Colony *)(this->super_Graph).cars;
  iVar19 = *(int *)((long)&this_00->super_Graph + lVar18 + 0x10);
  *(int *)((long)&this_00->super_Graph + lVar18 + 0x10) = iVar19 + 0x1e;
  if (0x492 < iVar19) goto LAB_00104aa5;
  goto LAB_00104960;
}

Assistant:

void Colony::move_ants()
{
	int car_idx = 0;
	while(!is_all_visited()){
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] denotes depot
		}
		std::vector< std::pair<int, int> > feasible_edges;
		feasible_edges.clear();
		while (feasible_edges.empty() && cars[car_idx].now_time <= 1200){
			for(int node_idx = 1; node_idx < num_node; node_idx++){
				if(!nodes[node_idx].visited){
					if(cars[car_idx].ok_capacity(nodes[node_idx])){
						if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
							feasible_edges.push_back(std::make_pair(cars[car_idx].now_idx, node_idx));
						}
					}
				}
			}
			if(feasible_edges.empty()){
				cars[car_idx].now_time += 30;// wait for the tw_open at the depot
			}
		}
		
		if(feasible_edges.empty()){// if still edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle			
			}
			else{
				std::cout << "cannot visit all customers this step." << std::endl;
				break;
			}
		}
		else{
			int next_node_idx;
			if (get_rand() < threshold){// choose randomly next node, this prevents local optimization
				next_node_idx = feasible_edges[rand() % feasible_edges.size()].second;
			}
			else{// follow heuristc and pheromone formula, choose next node
				std::vector<double> ups, probs, cumulative_sum;
				double sum = 0.0;
				for (auto feasible_edge : feasible_edges){
					double up = calc_prob(feasible_edge.first, feasible_edge.second);
					sum += up;
					ups.push_back(up);
				}
				for (auto up : ups){
					probs.push_back(up / sum);
				}
				cumulative_sum.push_back(probs.front());
				for (int i = 0; i < probs.size() - 1; i ++){
					probs[i+1] += probs[i];
					cumulative_sum.push_back(probs[i+1]);
				}
				int candi_idx, best_idx;
				double candi_v;
				double best_v = INFIN;
				double r = get_rand();
				for (int x = 0; x < cumulative_sum.size(); x++){
					if (r <= cumulative_sum[x]){
						candi_idx = x;
						candi_v = cumulative_sum[x];
						if (candi_v < best_v){
							best_idx = candi_idx;
							best_v = candi_v;
						}
					}
				}
				if (best_v == INFIN){
						break;
				}
				next_node_idx = feasible_edges[best_idx].second;
				
				// search algorithm
				// double rand = get_rand();
				// // std::sort(cumulative_sum.begin(), cumulative_sum.end());
				// for (auto itr = cumulative_sum.begin(); itr != cumulative_sum.end(); itr++){
				// 	if (rand_num < *itr){
				// 		int next_node_idx = itr;
				// 		break;
				// 	}
				// }
				// auto iter = std::max_element(cumulative_sum.begin(), cumulative_sum.end());
				// next_node_idx = std::distance(cumulative_sum.begin(), iter);// https://teramonagi.hatenablog.com/entry/20130225/1361793892
			}
			cars[car_idx].add_node(&nodes[next_node_idx], distance_matrix);
		}
	}// while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
		cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
}